

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Tags::Tag::Parse(Tag *this,IMkvReader *pReader,longlong pos,longlong size)

{
  longlong lVar1;
  longlong lVar2;
  long lVar3;
  long stop;
  longlong pos_local;
  Tag *local_48;
  longlong size_1;
  longlong id;
  
  stop = size + pos;
  pos_local = pos;
  local_48 = this;
  while( true ) {
    if (stop <= pos_local) {
      return (ulong)(pos_local == stop) * 2 + -2;
    }
    lVar3 = ParseElementHeader(pReader,&pos_local,stop,&id,&size_1);
    lVar2 = size_1;
    lVar1 = pos_local;
    if (lVar3 < 0) break;
    if (size_1 != 0) {
      if ((id == 0x67c8) && (lVar3 = ParseSimpleTag(local_48,pReader,pos_local,size_1), lVar3 < 0))
      {
        return lVar3;
      }
      pos_local = lVar1 + lVar2;
      if (stop < pos_local) {
        return -2;
      }
    }
  }
  return lVar3;
}

Assistant:

long Tags::Tag::Parse(IMkvReader* pReader, long long pos, long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)
      return status;

    if (size == 0)  // 0 length tag, read another
      continue;

    if (id == libwebm::kMkvSimpleTag) {
      status = ParseSimpleTag(pReader, pos, size);

      if (status < 0)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}